

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void loadMakeData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                 QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
                 QMultiHash<char,_QLatin1String> *other)

{
  if (makeDataInitialized == '\0') {
    initMakeData();
    makeDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&make_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&make_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&make_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&make_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&make_other);
  return;
}

Assistant:

void loadMakeData(QMultiHash<char, QLatin1String> &types,
                  QMultiHash<char, QLatin1String> &keywords,
                  QMultiHash<char, QLatin1String> &builtin,
                  QMultiHash<char, QLatin1String> &literals,
                  QMultiHash<char, QLatin1String> &other) {
    if (!makeDataInitialized) {
        initMakeData();
        makeDataInitialized = true;
    }
    types = make_types;
    keywords = make_keywords;
    builtin = make_builtin;
    literals = make_literals;
    other = make_other;
}